

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O3

void __thiscall stella::detail::StellaOutput::StellaOutput(StellaOutput *this)

{
  int iVar1;
  char *__nptr;
  
  this->pOut_ = (ostream *)&std::cout;
  this->level_ = 1;
  __nptr = getenv("STELLA_DEBUG");
  if (__nptr == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = atoi(__nptr);
  }
  this->maxlevel_ = iVar1;
  return;
}

Assistant:

StellaOutput()
    {
        pOut_ = &std::cout;
        level_ = 1;

        // Getting maxlevel from environment
        const char* pEnv = std::getenv("STELLA_DEBUG");
        if (!pEnv)
        {
            maxlevel_ = 0;
        }
        else
        {
            maxlevel_ = std::atoi(pEnv);
        }
    }